

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

TileLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_tile(NeuralNetworkLayer *this)

{
  ulong uVar1;
  TileLayerParams *pTVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x398) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x398;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pTVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::TileLayerParams>
                       (arena);
    (this->layer_).tile_ = pTVar2;
  }
  return (TileLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::TileLayerParams* NeuralNetworkLayer::_internal_mutable_tile() {
  if (!_internal_has_tile()) {
    clear_layer();
    set_has_tile();
    layer_.tile_ = CreateMaybeMessage< ::CoreML::Specification::TileLayerParams >(GetArenaForAllocation());
  }
  return layer_.tile_;
}